

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvisci.cpp
# Opt level: O1

void UConverter_fromUnicode_ISCII_OFFSETS_LOGIC(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  uint uVar1;
  char cVar2;
  UChar UVar3;
  short sVar4;
  ISCIILang IVar5;
  UConverter *pUVar6;
  UChar *pUVar7;
  byte *pbVar8;
  void *pvVar9;
  UChar *pUVar10;
  byte *pbVar11;
  byte *pbVar12;
  UChar *pUVar13;
  uint16_t uVar14;
  byte bVar16;
  uint uVar15;
  uint uVar17;
  UErrorCode UVar18;
  byte bVar19;
  ushort uVar20;
  int32_t iVar21;
  int32_t *piVar22;
  int iVar23;
  UChar *pUVar24;
  bool bVar25;
  uint local_44;
  
  pUVar6 = args->converter;
  pUVar13 = args->source;
  pUVar7 = args->sourceLimit;
  pbVar12 = (byte *)args->target;
  pbVar8 = (byte *)args->targetLimit;
  if ((pUVar7 < pUVar13 || pbVar8 < pbVar12) || pUVar6 == (UConverter *)0x0) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  uVar17 = pUVar6->fromUChar32;
  if (uVar17 == 0) {
    pUVar24 = pUVar13;
    if (pUVar13 < pUVar7) {
      piVar22 = args->offsets;
      pvVar9 = pUVar6->extraInfo;
      local_44 = (uint)(*(ushort *)((long)pvVar9 + 6) >> 7);
LAB_002c8a89:
      pUVar10 = pUVar13;
      do {
        pUVar24 = pUVar10;
        pUVar13 = pUVar13 + 1;
        pUVar6 = args->converter;
        if (pUVar6->fromUnicodeStatus == 10) {
          IVar5 = lookupInitialData[(ushort)local_44].isciiLang;
          pUVar6->fromUnicodeStatus = 0;
          bVar19 = (byte)IVar5;
          if (pbVar12 < pbVar8) {
            iVar23 = (int)((ulong)((long)pUVar13 + (-2 - (long)args->source)) >> 1) + -1;
            *pbVar12 = 0xef;
            if (piVar22 == (int32_t *)0x0) {
              piVar22 = (int32_t *)0x0;
            }
            else {
              *piVar22 = iVar23;
              piVar22 = piVar22 + 1;
            }
            if (pbVar12 + 1 < pbVar8) {
              pbVar12[1] = bVar19;
              if (piVar22 == (int32_t *)0x0) {
                piVar22 = (int32_t *)0x0;
                pbVar12 = pbVar12 + 2;
              }
              else {
                *piVar22 = iVar23;
                piVar22 = piVar22 + 1;
                pbVar12 = pbVar12 + 2;
              }
            }
            else {
              pUVar6 = args->converter;
              cVar2 = pUVar6->charErrorBufferLength;
              pUVar6->charErrorBufferLength = cVar2 + '\x01';
              pUVar6->charErrorBuffer[cVar2] = bVar19;
              *err = U_BUFFER_OVERFLOW_ERROR;
              pbVar12 = pbVar12 + 1;
            }
          }
          else {
            cVar2 = pUVar6->charErrorBufferLength;
            pUVar6->charErrorBufferLength = cVar2 + '\x01';
            pUVar6->charErrorBuffer[cVar2] = 0xef;
            pUVar6 = args->converter;
            cVar2 = pUVar6->charErrorBufferLength;
            pUVar6->charErrorBufferLength = cVar2 + '\x01';
            pUVar6->charErrorBuffer[cVar2] = bVar19;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          if (U_ZERO_ERROR < *err) break;
        }
        UVar3 = *pUVar24;
        uVar17 = (uint)(ushort)UVar3;
        if (uVar17 < 0xa1) {
          pUVar6 = args->converter;
          pUVar6->fromUnicodeStatus = uVar17;
          if (pbVar12 < pbVar8) {
            pUVar10 = args->source;
            *pbVar12 = (byte)UVar3;
            pbVar12 = pbVar12 + 1;
            if (piVar22 == (int32_t *)0x0) {
              piVar22 = (int32_t *)0x0;
            }
            else {
              *piVar22 = (int)((ulong)((long)pUVar13 - (long)pUVar10) >> 1) + -1;
              piVar22 = piVar22 + 1;
            }
          }
          else {
            cVar2 = pUVar6->charErrorBufferLength;
            pUVar6->charErrorBufferLength = cVar2 + '\x01';
            pUVar6->charErrorBuffer[cVar2] = (byte)UVar3;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          if (U_ZERO_ERROR < *err) goto LAB_002c90bf;
        }
        else {
          sVar4 = *(short *)((long)pvVar9 + 2);
          if (uVar17 != 0x200c) {
            if (uVar17 == 0x200d) {
              uVar15 = (uint)(sVar4 != 0) * 0x10 + 0xd9;
            }
            else {
              uVar1 = uVar17 - 0x900;
              uVar15 = 0xffff;
              if ((uVar1 & 0xffff) < 0x480) {
                if ((ushort)(UVar3 + L'\xf69a') < 0xfffe) {
                  uVar15 = uVar17 - 0x881;
                  if (-1 < (int)uVar1) {
                    uVar15 = uVar1;
                  }
                  local_44 = (int)uVar15 >> 7;
                  uVar20 = (ushort)uVar15 & 0xff80;
                  if ((uVar20 == *(ushort *)((long)pvVar9 + 6)) &&
                     (*(char *)((long)pvVar9 + 0x18) == '\0')) {
                    bVar25 = true;
                  }
                  else {
                    *(ushort *)((long)pvVar9 + 6) = uVar20;
                    *(MaskEnum *)((long)pvVar9 + 0xc) = lookupInitialData[(ushort)local_44].maskEnum
                    ;
                    *(undefined1 *)((long)pvVar9 + 0x18) = 0;
                    bVar25 = false;
                  }
                  if (*(ushort *)((long)pvVar9 + 6) == 0x100) {
                    if (uVar17 == 0xa70) {
                      uVar17 = 0xa02;
                    }
                    else if (uVar17 == 0xa71) {
                      *(undefined2 *)((long)pvVar9 + 2) = 0xa71;
                      uVar17 = 0xa71;
                    }
                  }
                  uVar17 = uVar17 - *(ushort *)((long)pvVar9 + 6);
                }
                else {
                  bVar25 = true;
                }
                uVar14 = fromUnicodeTable[uVar17 & 0xff];
                if ((*(uint *)((long)pvVar9 + 0xc) & (uint)""[uVar17 & 0xff]) == 0) {
                  if (*(short *)((long)pvVar9 + 6) != 0x300) {
                    uVar14 = 0xffff;
                  }
                  if (uVar17 != 0x931) {
                    uVar14 = 0xffff;
                  }
                }
                uVar15 = (uint)uVar14;
                if (!bVar25) {
                  bVar19 = (byte)lookupInitialData[(ushort)local_44].isciiLang;
                  if (pbVar12 < pbVar8) {
                    iVar23 = (int)((ulong)((long)pUVar13 - (long)args->source) >> 1) + -1;
                    *pbVar12 = 0xef;
                    if (piVar22 == (int32_t *)0x0) {
                      piVar22 = (int32_t *)0x0;
                    }
                    else {
                      *piVar22 = iVar23;
                      piVar22 = piVar22 + 1;
                    }
                    if (pbVar12 + 1 < pbVar8) {
                      pbVar12[1] = bVar19;
                      if (piVar22 == (int32_t *)0x0) {
                        piVar22 = (int32_t *)0x0;
                        pbVar12 = pbVar12 + 2;
                      }
                      else {
                        *piVar22 = iVar23;
                        piVar22 = piVar22 + 1;
                        pbVar12 = pbVar12 + 2;
                      }
                    }
                    else {
                      pUVar6 = args->converter;
                      cVar2 = pUVar6->charErrorBufferLength;
                      pUVar6->charErrorBufferLength = cVar2 + '\x01';
                      pUVar6->charErrorBuffer[cVar2] = bVar19;
                      *err = U_BUFFER_OVERFLOW_ERROR;
                      pbVar12 = pbVar12 + 1;
                    }
                  }
                  else {
                    pUVar6 = args->converter;
                    cVar2 = pUVar6->charErrorBufferLength;
                    pUVar6->charErrorBufferLength = cVar2 + '\x01';
                    pUVar6->charErrorBuffer[cVar2] = 0xef;
                    pUVar6 = args->converter;
                    cVar2 = pUVar6->charErrorBufferLength;
                    pUVar6->charErrorBufferLength = cVar2 + '\x01';
                    pUVar6->charErrorBuffer[cVar2] = bVar19;
                    *err = U_BUFFER_OVERFLOW_ERROR;
                  }
                  if (U_ZERO_ERROR < *err) goto LAB_002c8e69;
                }
                if ((uVar17 == 0x971) && (*(short *)((long)pvVar9 + 6) == 0x100)) goto LAB_002c9069;
              }
            }
            *(undefined2 *)((long)pvVar9 + 2) = 0;
            goto LAB_002c8e69;
          }
          *(undefined2 *)((long)pvVar9 + 2) = 0;
          if (sVar4 != 0) goto LAB_002c8ccb;
        }
        pUVar10 = pUVar24 + 1;
        if (pUVar7 <= pUVar24 + 1) goto LAB_002c90bf;
      } while( true );
    }
  }
  else {
LAB_002c8a09:
    UVar18 = U_ZERO_ERROR;
    if (pUVar13 < pUVar7) {
      bVar25 = ((ushort)*pUVar13 & 0xfc00) == 0xdc00;
      UVar18 = (uint)!bVar25 * 2 + U_INVALID_CHAR_FOUND;
      uVar1 = uVar17 * 0x400 + (uint)(ushort)*pUVar13 + 0xfca02400;
      if (!bVar25) {
        uVar1 = uVar17;
      }
      uVar17 = uVar1;
      pUVar13 = pUVar13 + bVar25;
    }
LAB_002c8a50:
    *err = UVar18;
    args->converter->fromUChar32 = uVar17;
    pUVar24 = pUVar13;
  }
LAB_002c8a5d:
  args->source = pUVar24;
  args->target = (char *)pbVar12;
  return;
LAB_002c8ccb:
  uVar15 = 0xe8;
LAB_002c8e69:
  bVar19 = (byte)uVar15;
  bVar16 = (byte)(uVar15 >> 8);
  if ((((*(short *)((long)pvVar9 + 6) == 0x100) && (sVar4 == 0xa71)) &&
      (0xffffffaf < uVar17 - 0x950)) && ((""[uVar17 - 0x900] & 1) != 0)) {
    *(undefined2 *)((long)pvVar9 + 2) = 0;
    bVar16 = bVar16 | 0xe8;
    if (pbVar12 < pbVar8) {
      iVar23 = (int)((ulong)((long)pUVar13 - (long)args->source) >> 1);
      iVar21 = iVar23 + -1;
      if (0xffff < (uVar15 << 0x10 | uVar15)) {
        *pbVar12 = bVar19;
        pbVar12 = pbVar12 + 1;
        if (piVar22 == (int32_t *)0x0) {
          piVar22 = (int32_t *)0x0;
        }
        else {
          iVar21 = iVar23 + -2;
          *piVar22 = iVar21;
          piVar22 = piVar22 + 1;
        }
      }
      if (pbVar12 < pbVar8) {
        *pbVar12 = bVar16;
        if (piVar22 == (int32_t *)0x0) {
          piVar22 = (int32_t *)0x0;
        }
        else {
          *piVar22 = iVar21;
          piVar22 = piVar22 + 1;
        }
        pbVar11 = pbVar12 + 1;
        if (pbVar8 <= pbVar12 + 1) {
LAB_002c9099:
          pbVar12 = pbVar11;
          pUVar6 = args->converter;
          cVar2 = pUVar6->charErrorBufferLength;
          pUVar6->charErrorBufferLength = cVar2 + '\x01';
          pUVar6->charErrorBuffer[cVar2] = bVar19;
          *err = U_BUFFER_OVERFLOW_ERROR;
          goto LAB_002c9064;
        }
        pbVar12[1] = bVar19;
        pbVar12 = pbVar12 + 2;
        if (piVar22 == (int32_t *)0x0) goto LAB_002c90ba;
        *piVar22 = iVar21;
        goto LAB_002c9009;
      }
      pUVar6 = args->converter;
      cVar2 = pUVar6->charErrorBufferLength;
      pUVar6->charErrorBufferLength = cVar2 + '\x01';
      pUVar6->charErrorBuffer[cVar2] = bVar16;
      pUVar6 = args->converter;
      cVar2 = pUVar6->charErrorBufferLength;
      pUVar6->charErrorBufferLength = cVar2 + '\x01';
      pUVar6->charErrorBuffer[cVar2] = bVar19;
    }
    else {
      if ((uVar15 << 0x10 & 0xff0000) != 0) {
        pUVar6 = args->converter;
        cVar2 = pUVar6->charErrorBufferLength;
        pUVar6->charErrorBufferLength = cVar2 + '\x01';
        pUVar6->charErrorBuffer[cVar2] = bVar19;
      }
      pUVar6 = args->converter;
      cVar2 = pUVar6->charErrorBufferLength;
      pUVar6->charErrorBufferLength = cVar2 + '\x01';
      pUVar6->charErrorBuffer[cVar2] = bVar16;
      pUVar6 = args->converter;
      cVar2 = pUVar6->charErrorBufferLength;
      pUVar6->charErrorBufferLength = cVar2 + '\x01';
      pUVar6->charErrorBuffer[cVar2] = bVar19;
    }
  }
  else {
    if (uVar15 == 0xe8) {
      *(undefined2 *)((long)pvVar9 + 2) = 0xe8;
    }
    else if (uVar15 == 0xffff) {
      pUVar13 = pUVar24 + 1;
      UVar18 = U_INVALID_CHAR_FOUND;
      if (((uVar17 & 0xfffff800) != 0xd800) ||
         (UVar18 = U_ILLEGAL_CHAR_FOUND, (uVar17 >> 10 & 1) != 0)) goto LAB_002c8a50;
      goto LAB_002c8a09;
    }
    if (pbVar12 < pbVar8) {
      iVar23 = (int)((ulong)((long)pUVar13 - (long)args->source) >> 1) + -1;
      if (uVar15 < 0x100) {
        *pbVar12 = bVar19;
        pbVar12 = pbVar12 + 1;
      }
      else {
        *pbVar12 = bVar16;
        if (piVar22 == (int32_t *)0x0) {
          piVar22 = (int32_t *)0x0;
        }
        else {
          *piVar22 = iVar23;
          piVar22 = piVar22 + 1;
        }
        pbVar11 = pbVar12 + 1;
        if (pbVar8 <= pbVar12 + 1) goto LAB_002c9099;
        pbVar12[1] = bVar19;
        pbVar12 = pbVar12 + 2;
      }
      if (piVar22 == (int32_t *)0x0) {
LAB_002c90ba:
        piVar22 = (int32_t *)0x0;
        goto LAB_002c9064;
      }
      *piVar22 = iVar23;
LAB_002c9009:
      piVar22 = piVar22 + 1;
      goto LAB_002c9064;
    }
    if ((uVar15 & 0xff00) != 0) {
      pUVar6 = args->converter;
      cVar2 = pUVar6->charErrorBufferLength;
      pUVar6->charErrorBufferLength = cVar2 + '\x01';
      pUVar6->charErrorBuffer[cVar2] = bVar16;
    }
    pUVar6 = args->converter;
    cVar2 = pUVar6->charErrorBufferLength;
    pUVar6->charErrorBufferLength = cVar2 + '\x01';
    pUVar6->charErrorBuffer[cVar2] = bVar19;
  }
  *err = U_BUFFER_OVERFLOW_ERROR;
LAB_002c9064:
  if (U_ZERO_ERROR < *err) goto LAB_002c90bf;
LAB_002c9069:
  pUVar13 = pUVar24 + 1;
  if (pUVar7 <= pUVar13) goto LAB_002c90bf;
  goto LAB_002c8a89;
LAB_002c90bf:
  pUVar24 = pUVar24 + 1;
  goto LAB_002c8a5d;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISCII_OFFSETS_LOGIC(
        UConverterFromUnicodeArgs * args, UErrorCode * err) {
    const UChar *source = args->source;
    const UChar *sourceLimit = args->sourceLimit;
    unsigned char *target = (unsigned char *) args->target;
    unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    int32_t* offsets = args->offsets;
    uint32_t targetByteUnit = 0x0000;
    UChar32 sourceChar = 0x0000;
    UChar32 tempContextFromUnicode = 0x0000;    /* For special handling of the Gurmukhi script. */
    UConverterDataISCII *converterData;
    uint16_t newDelta=0;
    uint16_t range = 0;
    UBool deltaChanged = FALSE;

    if ((args->converter == NULL) || (args->targetLimit < args->target) || (args->sourceLimit < args->source)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    /* initialize data */
    converterData=(UConverterDataISCII*)args->converter->extraInfo;
    newDelta=converterData->currentDeltaFromUnicode;
    range = (uint16_t)(newDelta/DELTA);

    if ((sourceChar = args->converter->fromUChar32)!=0) {
        goto getTrail;
    }

    /*writing the char to the output stream */
    while (source < sourceLimit) {
        /* Write the language code following LF only if LF is not the last character. */
        if (args->converter->fromUnicodeStatus == LF) {
            targetByteUnit = ATR<<8;
            targetByteUnit += (uint8_t) lookupInitialData[range].isciiLang;
            args->converter->fromUnicodeStatus = 0x0000;
            /* now append ATR and language code */
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        }
        
        sourceChar = *source++;
        tempContextFromUnicode = converterData->contextCharFromUnicode;
        
        targetByteUnit = missingCharMarker;
        
        /*check if input is in ASCII and C0 control codes range*/
        if (sourceChar <= ASCII_END) {
            args->converter->fromUnicodeStatus = sourceChar;
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,sourceChar,err);
            if (U_FAILURE(*err)) {
                break;
            }
            continue;
        }
        switch (sourceChar) {
        case ZWNJ:
            /* contextChar has HALANT */
            if (converterData->contextCharFromUnicode) {
                converterData->contextCharFromUnicode = 0x00;
                targetByteUnit = ISCII_HALANT;
            } else {
                /* consume ZWNJ and continue */
                converterData->contextCharFromUnicode = 0x00;
                continue;
            }
            break;
        case ZWJ:
            /* contextChar has HALANT */
            if (converterData->contextCharFromUnicode) {
                targetByteUnit = ISCII_NUKTA;
            } else {
                targetByteUnit =ISCII_INV;
            }
            converterData->contextCharFromUnicode = 0x00;
            break;
        default:
            /* is the sourceChar in the INDIC_RANGE? */
            if ((uint16_t)(INDIC_BLOCK_END-sourceChar) <= INDIC_RANGE) {
                /* Danda and Double Danda are valid in Northern scripts.. since Unicode
                 * does not include these codepoints in all Northern scrips we need to
                 * filter them out
                 */
                if (sourceChar!= DANDA && sourceChar != DOUBLE_DANDA) {
                    /* find out to which block the souceChar belongs*/
                    range =(uint16_t)((sourceChar-INDIC_BLOCK_BEGIN)/DELTA);
                    newDelta =(uint16_t)(range*DELTA);

                    /* Now are we in the same block as the previous? */
                    if (newDelta!= converterData->currentDeltaFromUnicode || converterData->isFirstBuffer) {
                        converterData->currentDeltaFromUnicode = newDelta;
                        converterData->currentMaskFromUnicode = lookupInitialData[range].maskEnum;
                        deltaChanged =TRUE;
                        converterData->isFirstBuffer=FALSE;
                    }
                    
                    if (converterData->currentDeltaFromUnicode == PNJ_DELTA) { 
                        if (sourceChar == PNJ_TIPPI) {
                            /* Make sure Tippi is converterd to Bindi. */
                            sourceChar = PNJ_BINDI;
                        } else if (sourceChar == PNJ_ADHAK) {
                            /* This is for consonant cluster handling. */
                            converterData->contextCharFromUnicode = PNJ_ADHAK;
                        }
                        
                    }
                    /* Normalize all Indic codepoints to Devanagari and map them to ISCII */
                    /* now subtract the new delta from sourceChar*/
                    sourceChar -= converterData->currentDeltaFromUnicode;
                }

                /* get the target byte unit */
                targetByteUnit=fromUnicodeTable[(uint8_t)sourceChar];

                /* is the code point valid in current script? */
                if ((validityTable[(uint8_t)sourceChar] & converterData->currentMaskFromUnicode)==0) {
                    /* Vocallic RR is assigned in ISCII Telugu and Unicode */
                    if (converterData->currentDeltaFromUnicode!=(TELUGU_DELTA) || sourceChar!=VOCALLIC_RR) {
                        targetByteUnit=missingCharMarker;
                    }
                }

                if (deltaChanged) {
                    /* we are in a script block which is different than
                     * previous sourceChar's script block write ATR and language codes
                     */
                    uint32_t temp=0;
                    temp =(uint16_t)(ATR<<8);
                    temp += (uint16_t)((uint8_t) lookupInitialData[range].isciiLang);
                    /* reset */
                    deltaChanged=FALSE;
                    /* now append ATR and language code */
                    WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,temp,err);
                    if (U_FAILURE(*err)) {
                        break;
                    }
                }
                
                if (converterData->currentDeltaFromUnicode == PNJ_DELTA && (sourceChar + PNJ_DELTA) == PNJ_ADHAK) {
                    continue;
                }
            }
            /* reset context char */
            converterData->contextCharFromUnicode = 0x00;
            break;
        }
        if (converterData->currentDeltaFromUnicode == PNJ_DELTA && tempContextFromUnicode == PNJ_ADHAK && isPNJConsonant((sourceChar + PNJ_DELTA))) {
            /* If the previous codepoint is Adhak and the current codepoint is a consonant, the targetByteUnit should be C + Halant + C. */
            /* reset context char */
            converterData->contextCharFromUnicode = 0x0000;
            targetByteUnit = targetByteUnit << 16 | ISCII_HALANT << 8 | targetByteUnit;
            /* write targetByteUnit to target */
            WRITE_TO_TARGET_FROM_U(args, offsets, source, target, targetLimit, targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        } else if (targetByteUnit != missingCharMarker) {
            if (targetByteUnit==ISCII_HALANT) {
                converterData->contextCharFromUnicode = (UChar)targetByteUnit;
            }
            /* write targetByteUnit to target*/
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        } else {
            /* oops.. the code point is unassigned */
            /*check if the char is a First surrogate*/
            if (U16_IS_SURROGATE(sourceChar)) {
                if (U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if (source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail= (*source);
                        if (U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            *err =U_INVALID_CHAR_FOUND;
                            /* convert this surrogate code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                        }
                    } else {
                        /* no more input */
                        *err = U_ZERO_ERROR;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                }
            } else {
                /* callback(unassigned) for a BMP code point */
                *err = U_INVALID_CHAR_FOUND;
            }

            args->converter->fromUChar32=sourceChar;
            break;
        }
    }/* end while(mySourceIndex<mySourceLength) */

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}